

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_range_join.cpp
# Opt level: O3

void __thiscall
duckdb::PhysicalRangeJoin::GlobalSortedTable::GlobalSortedTable
          (GlobalSortedTable *this,ClientContext *context,
          vector<duckdb::BoundOrderByNode,_true> *orders,RowLayout *payload_layout,
          PhysicalOperator *op_p)

{
  ClientConfig *pCVar1;
  idx_t iVar2;
  
  this->op = op_p;
  GlobalSortState::GlobalSortState(&this->global_sort_state,context,orders,payload_layout);
  (this->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
  super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (bool *)0x0;
  this->memory_per_thread = 0;
  (this->has_null).super___atomic_base<unsigned_long>._M_i = 0;
  (this->count).super___atomic_base<unsigned_long>._M_i = 0;
  pCVar1 = ClientConfig::GetConfig(context);
  (this->global_sort_state).external = pCVar1->force_external;
  iVar2 = PhysicalOperator::GetMaxThreadMemory(context);
  this->memory_per_thread = iVar2;
  return;
}

Assistant:

PhysicalRangeJoin::GlobalSortedTable::GlobalSortedTable(ClientContext &context, const vector<BoundOrderByNode> &orders,
                                                        RowLayout &payload_layout, const PhysicalOperator &op_p)
    : op(op_p), global_sort_state(context, orders, payload_layout), has_null(0), count(0), memory_per_thread(0) {

	// Set external (can be forced with the PRAGMA)
	auto &config = ClientConfig::GetConfig(context);
	global_sort_state.external = config.force_external;
	memory_per_thread = PhysicalRangeJoin::GetMaxThreadMemory(context);
}